

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_enc.c
# Opt level: O2

void aom_highbd_upsampled_pred_c
               (MACROBLOCKD *xd,AV1Common *cm,int mi_row,int mi_col,MV *mv,uint8_t *comp_pred8,
               int width,int height,int subpel_x_q3,int subpel_y_q3,uint8_t *ref8,int ref_stride,
               int bd,int subpel_search)

{
  ushort uVar1;
  int subsampling_x;
  int subsampling_y;
  long lVar2;
  int iVar3;
  void *__dest;
  uint is_intrabc;
  void *__src;
  scale_factors *sf;
  long *plVar4;
  bool bVar5;
  undefined1 auStackY_a138 [168];
  undefined8 uStackY_a090;
  uint16_t temp [20480];
  
  if (xd != (MACROBLOCKD *)0x0) {
    uVar1 = *(ushort *)&(*xd->mi)->field_0xa7 >> 7;
    is_intrabc = uVar1 & 1;
    if ((uVar1 & 1) == 0) {
      sf = xd->block_ref_scale_factors[0];
    }
    else {
      sf = &cm->sf_identity;
    }
    iVar3 = av1_is_scaled(sf);
    if (iVar3 != 0) {
      iVar3 = xd->bd;
      temp._68_4_ = 3;
      if (10 < iVar3) {
        temp._68_4_ = iVar3 + -7;
      }
      temp._72_4_ = 0xb;
      if (10 < iVar3) {
        temp._72_4_ = 0x15 - iVar3;
      }
      temp[0x18] = 0;
      temp[0x19] = 0;
      temp[0x1c] = 0;
      temp[0x1d] = 0;
      temp[0x1e] = 0;
      temp[0x1f] = 0;
      temp[0x20] = 0;
      temp[0x21] = 0;
      temp[0x26] = 0;
      temp[0x27] = 0;
      temp[0x28] = 0;
      temp[0x29] = 0;
      temp[0x2a] = 0;
      temp[0x2b] = 0;
      subsampling_x = xd->plane[0].subsampling_x;
      subsampling_y = xd->plane[0].subsampling_y;
      uStackY_a090 = 0x20e6cb;
      av1_init_inter_params
                ((InterPredParams *)temp,width,height,(mi_row << 2) >> ((byte)subsampling_y & 0x1f),
                 (mi_col << 2) >> ((byte)subsampling_x & 0x1f),subsampling_x,subsampling_y,iVar3,
                 (uint)xd->cur_buf->flags >> 3 & 1,is_intrabc,sf,
                 xd->plane[0].pre + ((ulong)((short)is_intrabc == 0) - 1),(int_interpfilters)0x0);
      build_one_inter_predictor(comp_pred8,width,mv,(InterPredParams *)temp);
      return;
    }
  }
  if (subpel_search - 1U < 3) {
    plVar4 = *(long **)(&DAT_00559ce0 + (ulong)(subpel_search - 1U) * 8);
  }
  else {
    plVar4 = (long *)0x0;
  }
  if (subpel_y_q3 == 0 && subpel_x_q3 == 0) {
    __src = (void *)((long)ref8 * 2);
    __dest = (void *)((long)comp_pred8 * 2);
    iVar3 = 0;
    if (0 < height) {
      iVar3 = height;
    }
    while (bVar5 = iVar3 != 0, iVar3 = iVar3 + -1, bVar5) {
      memcpy(__dest,__src,(long)width * 2);
      __dest = (void *)((long)__dest + (long)width * 2);
      __src = (void *)((long)__src + (long)ref_stride * 2);
    }
  }
  else if (subpel_y_q3 == 0) {
    aom_highbd_convolve8_horiz_c
              (ref8,(long)ref_stride,comp_pred8,(long)width,
               (int16_t *)((long)(subpel_x_q3 * 2) * (ulong)*(ushort *)(plVar4 + 1) * 2 + *plVar4),
               0x10,(int16_t *)0x0,-1,width,height,bd);
  }
  else if (subpel_x_q3 == 0) {
    aom_highbd_convolve8_vert_c
              (ref8,(long)ref_stride,comp_pred8,(long)width,(int16_t *)0x0,-1,
               (int16_t *)((long)(subpel_y_q3 * 2) * (ulong)*(ushort *)(plVar4 + 1) * 2 + *plVar4),
               0x10,width,height,bd);
  }
  else {
    lVar2 = *plVar4;
    uVar1 = *(ushort *)(plVar4 + 1);
    aom_highbd_convolve8_horiz_c
              (ref8 + -(long)(int)(((uVar1 >> 1) - 1) * ref_stride),(long)ref_stride,
               (uint8_t *)((ulong)temp >> 1),0x80,
               (int16_t *)(lVar2 + (long)(subpel_x_q3 * 2) * (ulong)uVar1 * 2),0x10,(int16_t *)0x0,
               -1,width,(subpel_y_q3 + height * 8 + -8 >> 3) + (uint)uVar1,bd);
    aom_highbd_convolve8_vert_c
              ((uint8_t *)((ulong)(auStackY_a138 + ((*(ushort *)(plVar4 + 1) & 0xfffe) << 7)) >> 1),
               0x80,comp_pred8,(long)width,(int16_t *)0x0,-1,
               (int16_t *)(lVar2 + (long)(subpel_y_q3 * 2) * (ulong)uVar1 * 2),0x10,width,height,bd)
    ;
  }
  return;
}

Assistant:

void aom_highbd_upsampled_pred_c(MACROBLOCKD *xd,
                                 const struct AV1Common *const cm, int mi_row,
                                 int mi_col, const MV *const mv,
                                 uint8_t *comp_pred8, int width, int height,
                                 int subpel_x_q3, int subpel_y_q3,
                                 const uint8_t *ref8, int ref_stride, int bd,
                                 int subpel_search) {
  // expect xd == NULL only in tests
  if (xd != NULL) {
    const MB_MODE_INFO *mi = xd->mi[0];
    const int ref_num = 0;
    const int is_intrabc = is_intrabc_block(mi);
    const struct scale_factors *const sf =
        is_intrabc ? &cm->sf_identity : xd->block_ref_scale_factors[ref_num];
    const int is_scaled = av1_is_scaled(sf);

    if (is_scaled) {
      int plane = 0;
      const int mi_x = mi_col * MI_SIZE;
      const int mi_y = mi_row * MI_SIZE;
      const struct macroblockd_plane *const pd = &xd->plane[plane];
      const struct buf_2d *const dst_buf = &pd->dst;
      const struct buf_2d *const pre_buf =
          is_intrabc ? dst_buf : &pd->pre[ref_num];

      InterPredParams inter_pred_params;
      inter_pred_params.conv_params = get_conv_params(0, plane, xd->bd);
      const int_interpfilters filters =
          av1_broadcast_interp_filter(EIGHTTAP_REGULAR);
      av1_init_inter_params(
          &inter_pred_params, width, height, mi_y >> pd->subsampling_y,
          mi_x >> pd->subsampling_x, pd->subsampling_x, pd->subsampling_y,
          xd->bd, is_cur_buf_hbd(xd), is_intrabc, sf, pre_buf, filters);
      av1_enc_build_one_inter_predictor(comp_pred8, width, mv,
                                        &inter_pred_params);
      return;
    }
  }

  const InterpFilterParams *filter = av1_get_filter(subpel_search);

  if (!subpel_x_q3 && !subpel_y_q3) {
    const uint16_t *ref = CONVERT_TO_SHORTPTR(ref8);
    uint16_t *comp_pred = CONVERT_TO_SHORTPTR(comp_pred8);
    for (int i = 0; i < height; i++) {
      memcpy(comp_pred, ref, width * sizeof(*comp_pred));
      comp_pred += width;
      ref += ref_stride;
    }
  } else if (!subpel_y_q3) {
    const int16_t *const kernel =
        av1_get_interp_filter_subpel_kernel(filter, subpel_x_q3 << 1);
    aom_highbd_convolve8_horiz_c(ref8, ref_stride, comp_pred8, width, kernel,
                                 16, NULL, -1, width, height, bd);
  } else if (!subpel_x_q3) {
    const int16_t *const kernel =
        av1_get_interp_filter_subpel_kernel(filter, subpel_y_q3 << 1);
    aom_highbd_convolve8_vert_c(ref8, ref_stride, comp_pred8, width, NULL, -1,
                                kernel, 16, width, height, bd);
  } else {
    DECLARE_ALIGNED(16, uint16_t,
                    temp[((MAX_SB_SIZE + 16) + 16) * MAX_SB_SIZE]);
    const int16_t *const kernel_x =
        av1_get_interp_filter_subpel_kernel(filter, subpel_x_q3 << 1);
    const int16_t *const kernel_y =
        av1_get_interp_filter_subpel_kernel(filter, subpel_y_q3 << 1);
    const int intermediate_height =
        (((height - 1) * 8 + subpel_y_q3) >> 3) + filter->taps;
    assert(intermediate_height <= (MAX_SB_SIZE * 2 + 16) + 16);
    aom_highbd_convolve8_horiz_c(ref8 - ref_stride * ((filter->taps >> 1) - 1),
                                 ref_stride, CONVERT_TO_BYTEPTR(temp),
                                 MAX_SB_SIZE, kernel_x, 16, NULL, -1, width,
                                 intermediate_height, bd);
    aom_highbd_convolve8_vert_c(
        CONVERT_TO_BYTEPTR(temp + MAX_SB_SIZE * ((filter->taps >> 1) - 1)),
        MAX_SB_SIZE, comp_pred8, width, NULL, -1, kernel_y, 16, width, height,
        bd);
  }
}